

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall cmMakefileTargetGenerator::WriteTargetDependRules(cmMakefileTargetGenerator *this)

{
  string *localPath;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmGeneratedFileStream *pcVar3;
  cmLocalUnixMakefileGenerator3 *pcVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  bool bVar7;
  cmGeneratedFileStream *this_00;
  ostream *poVar8;
  _Base_ptr p_Var9;
  string *psVar10;
  undefined8 in_R8;
  string *d;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view str;
  string_view str_00;
  string_view source;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  string_view source_03;
  string_view source_04;
  string local_308;
  string depTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string dir;
  ostringstream depCmd;
  undefined1 local_198 [96];
  ios_base local_138 [264];
  
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xe])
            (&dir,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  _Var6 = dir._M_dataplus;
  _depCmd = (pointer)dir._M_string_length;
  local_198._0_8_ = 0x11;
  local_198._8_8_ = "/DependInfo.cmake";
  views._M_len = 2;
  views._M_array = (iterator)&depCmd;
  cmCatViews_abi_cxx11_(&depTarget,views);
  localPath = &this->InfoFileNameFull;
  std::__cxx11::string::operator=((string *)localPath,(string *)&depTarget);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)depTarget._M_dataplus._M_p != &depTarget.field_2) {
    operator_delete(depTarget._M_dataplus._M_p,depTarget.field_2._M_allocated_capacity + 1);
  }
  cmLocalUnixMakefileGenerator3::ConvertToFullPath((string *)&depCmd,this->LocalGenerator,localPath)
  ;
  std::__cxx11::string::operator=((string *)localPath,(string *)&depCmd);
  if (_depCmd != local_198) {
    operator_delete(_depCmd,local_198._0_8_ + 1);
  }
  this_00 = (cmGeneratedFileStream *)operator_new(0x268);
  cmGeneratedFileStream::cmGeneratedFileStream(this_00,localPath,false,None);
  pcVar3 = (this->InfoFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  (this->InfoFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = this_00;
  if (pcVar3 != (cmGeneratedFileStream *)0x0) {
    (**(code **)(*(long *)&(pcVar3->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_> + 8))();
    this_00 = (this->InfoFileStream)._M_t.
              super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
              .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    if (this_00 == (cmGeneratedFileStream *)0x0) goto LAB_00476eb1;
  }
  cmGeneratedFileStream::SetCopyIfDifferent(this_00,true);
  cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
            (this->LocalGenerator,
             (ostream *)
             (this->InfoFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
             (this->super_cmCommonTargetGenerator).GeneratorTarget);
  if ((this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pcVar3 = (this->InfoFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar3,"# Pairs of files generated by the same build rule.\n",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar3,"set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n",0x20);
    p_Var9 = (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      do {
        pcVar3 = (this->InfoFileStream)._M_t.
                 super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                 .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,"  ",2);
        str._M_str = (char *)0x0;
        str._M_len = *(ulong *)(p_Var9 + 1);
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  ((string *)&depCmd,(cmOutputConverter *)p_Var9[1]._M_parent,str,(WrapQuotes)in_R8)
        ;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)pcVar3,_depCmd,(long)_Var6._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        str_00._M_str = (char *)0x0;
        str_00._M_len = *(ulong *)(p_Var9 + 2);
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&depTarget,(cmOutputConverter *)p_Var9[2]._M_parent,str_00,(WrapQuotes)in_R8);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,depTarget._M_dataplus._M_p,depTarget._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)depTarget._M_dataplus._M_p != &depTarget.field_2) {
          operator_delete(depTarget._M_dataplus._M_p,depTarget.field_2._M_allocated_capacity + 1);
        }
        if (_depCmd != local_198) {
          operator_delete(_depCmd,local_198._0_8_ + 1);
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (this->InfoFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"  )\n\n",5);
  }
  pcVar3 = (this->InfoFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar3,"# Targets to which this target links.\n",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar3,"set(CMAKE_TARGET_LINKED_INFO_FILES\n",0x23);
  GetConfigName_abi_cxx11_((string *)&depCmd,this);
  cmCommonTargetGenerator::GetLinkedTargetDirectories
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&depTarget,&this->super_cmCommonTargetGenerator,(string *)&depCmd);
  _Var5 = depTarget._M_dataplus;
  if (_depCmd != local_198) {
    operator_delete(_depCmd,local_198._0_8_ + 1);
    _Var5 = depTarget._M_dataplus;
  }
  for (; _Var5._M_p != (pointer)depTarget._M_string_length; _Var5._M_p = _Var5._M_p + 0x20) {
    pcVar3 = (this->InfoFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,"  \"",3);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)pcVar3,*(char **)_Var5._M_p,*(long *)(_Var5._M_p + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/DependInfo.cmake\"\n",0x13);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (this->InfoFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"  )\n",4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&depTarget);
  psVar10 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                      ((cmLocalGenerator *)this->LocalGenerator);
  pcVar3 = (this->InfoFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar3,"# Fortran module output directory.\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar3,"set(CMAKE_Fortran_TARGET_MODULE_DIR \"",0x25);
  cmGeneratorTarget::GetFortranModuleDirectory
            ((string *)&depCmd,(this->super_cmCommonTargetGenerator).GeneratorTarget,psVar10);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar3,_depCmd,(long)_Var6._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
  if (_depCmd != local_198) {
    operator_delete(_depCmd,local_198._0_8_ + 1);
  }
  bVar7 = cmGeneratorTarget::IsFortranBuildingInstrinsicModules
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  if (bVar7) {
    pcVar3 = (this->InfoFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar3,"# Fortran compiler is building intrinsic modules.\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar3,"set(CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES ON) \n",0x3a)
    ;
  }
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
            (&local_308,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  _depCmd = (pointer)local_308._M_string_length;
  local_198._0_8_ = 7;
  local_198._8_8_ = "/depend";
  views_00._M_len = 2;
  views_00._M_array = (iterator)&depCmd;
  cmCatViews_abi_cxx11_(&depTarget,views_00);
  paVar2 = &local_308.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != paVar2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&depCmd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&depCmd,"cd ",3);
  pcVar4 = this->LocalGenerator;
  psVar10 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar4);
  source._M_str = (psVar10->_M_dataplus)._M_p;
  source._M_len = psVar10->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_308,
             &(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             source,SHELL);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&depCmd,local_308._M_dataplus._M_p,local_308._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," && ",4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != paVar2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&depCmd,"$(CMAKE_COMMAND) -E cmake_depends \"",0x23);
  (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
    _vptr_cmGlobalGenerator[3])(&local_308);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&depCmd,local_308._M_dataplus._M_p,local_308._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" ",2);
  pcVar4 = this->LocalGenerator;
  psVar10 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar4);
  source_00._M_str = (psVar10->_M_dataplus)._M_p;
  source_00._M_len = psVar10->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_1e8,
             &(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             source_00,SHELL);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  pcVar4 = this->LocalGenerator;
  psVar10 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar4);
  source_01._M_str = (psVar10->_M_dataplus)._M_p;
  source_01._M_len = psVar10->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_208,
             &(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             source_01,SHELL);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  pcVar4 = this->LocalGenerator;
  psVar10 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar4);
  source_02._M_str = (psVar10->_M_dataplus)._M_p;
  source_02._M_len = psVar10->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_228,
             &(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             source_02,SHELL);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  pcVar4 = this->LocalGenerator;
  psVar10 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar4);
  source_03._M_str = (psVar10->_M_dataplus)._M_p;
  source_03._M_len = psVar10->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_248,
             &(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             source_03,SHELL);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_248._M_dataplus._M_p,local_248._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  pcVar4 = this->LocalGenerator;
  cmsys::SystemTools::CollapseFullPath(&local_288,localPath);
  source_04._M_str = local_288._M_dataplus._M_p;
  source_04._M_len = local_288._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_268,
             &(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             source_04,SHELL);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,local_268._M_dataplus._M_p,local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != paVar2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if (this->LocalGenerator->ColorMakefile == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&depCmd," --color=$(COLOR)",0x11);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != paVar2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if (this->CustomCommandDriver == OnDepends) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               &(this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header);
  }
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (this->LocalGenerator,
             (ostream *)
             (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,(char *)0x0,
             &depTarget,&depends,&commands,true,false);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depCmd);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)depTarget._M_dataplus._M_p != &depTarget.field_2) {
    operator_delete(depTarget._M_dataplus._M_p,depTarget.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
LAB_00476eb1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dir._M_dataplus._M_p != &dir.field_2) {
    operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetDependRules()
{
  // must write the targets depend info file
  std::string dir =
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  this->InfoFileNameFull = cmStrCat(dir, "/DependInfo.cmake");
  this->InfoFileNameFull =
    this->LocalGenerator->ConvertToFullPath(this->InfoFileNameFull);
  this->InfoFileStream =
    cm::make_unique<cmGeneratedFileStream>(this->InfoFileNameFull);
  if (!this->InfoFileStream) {
    return;
  }
  this->InfoFileStream->SetCopyIfDifferent(true);
  this->LocalGenerator->WriteDependLanguageInfo(*this->InfoFileStream,
                                                this->GeneratorTarget);

  // Store multiple output pairs in the depend info file.
  if (!this->MultipleOutputPairs.empty()) {
    /* clang-format off */
    *this->InfoFileStream
      << "\n"
      << "# Pairs of files generated by the same build rule.\n"
      << "set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n";
    /* clang-format on */
    for (auto const& pi : this->MultipleOutputPairs) {
      *this->InfoFileStream
        << "  " << cmOutputConverter::EscapeForCMake(pi.first) << " "
        << cmOutputConverter::EscapeForCMake(pi.second) << "\n";
    }
    *this->InfoFileStream << "  )\n\n";
  }

  // Store list of targets linked directly or transitively.
  {
    /* clang-format off */
  *this->InfoFileStream
    << "\n"
    << "# Targets to which this target links.\n"
    << "set(CMAKE_TARGET_LINKED_INFO_FILES\n";
    /* clang-format on */
    std::vector<std::string> dirs =
      this->GetLinkedTargetDirectories(this->GetConfigName());
    for (std::string const& d : dirs) {
      *this->InfoFileStream << "  \"" << d << "/DependInfo.cmake\"\n";
    }
    *this->InfoFileStream << "  )\n";
  }

  std::string const& working_dir =
    this->LocalGenerator->GetCurrentBinaryDirectory();

  /* clang-format off */
  *this->InfoFileStream
    << "\n"
    << "# Fortran module output directory.\n"
    << "set(CMAKE_Fortran_TARGET_MODULE_DIR \""
    << this->GeneratorTarget->GetFortranModuleDirectory(working_dir)
    << "\")\n";

  if (this->GeneratorTarget->IsFortranBuildingInstrinsicModules()) {
    *this->InfoFileStream
      << "\n"
      << "# Fortran compiler is building intrinsic modules.\n"
      << "set(CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES ON) \n";
  }
  /* clang-format on */

  // and now write the rule to use it
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // Construct the name of the dependency generation target.
  std::string depTarget = cmStrCat(
    this->LocalGenerator->GetRelativeTargetDirectory(this->GeneratorTarget),
    "/depend");

  // Add a command to call CMake to scan dependencies.  CMake will
  // touch the corresponding depends file after scanning dependencies.
  std::ostringstream depCmd;
// TODO: Account for source file properties and directory-level
// definitions when scanning for dependencies.
#if !defined(_WIN32) || defined(__CYGWIN__)
  // This platform supports symlinks, so cmSystemTools will translate
  // paths.  Make sure PWD is set to the original name of the home
  // output directory to help cmSystemTools to create the same
  // translation table for the dependency scanning process.
  depCmd << "cd "
         << (this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetBinaryDirectory(),
              cmOutputConverter::SHELL))
         << " && ";
#endif
  // Generate a call this signature:
  //
  //   cmake -E cmake_depends <generator>
  //                          <home-src-dir> <start-src-dir>
  //                          <home-out-dir> <start-out-dir>
  //                          <dep-info> --color=$(COLOR)
  //
  // This gives the dependency scanner enough information to recreate
  // the state of our local generator sufficiently for its needs.
  depCmd << "$(CMAKE_COMMAND) -E cmake_depends \""
         << this->GlobalGenerator->GetName() << "\" "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetSourceDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetCurrentSourceDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetBinaryDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetCurrentBinaryDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(this->InfoFileNameFull),
              cmOutputConverter::SHELL);
  if (this->LocalGenerator->GetColorMakefile()) {
    depCmd << " --color=$(COLOR)";
  }
  commands.push_back(depCmd.str());

  // Make sure all custom command outputs in this target are built.
  if (this->CustomCommandDriver == OnDepends) {
    this->DriveCustomCommands(depends);
  }

  // Write the rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      depTarget, depends, commands, true);
}